

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_GetStringView_Test::TestBody
          (GeneratedMessageReflectionTest_GetStringView_Test *this)

{
  bool bVar1;
  Reflection *this_00;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  AssertHelper local_478;
  Message local_470;
  allocator<char> local_461;
  string local_460;
  string_view local_440;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_2;
  Message local_418;
  allocator<char> local_409;
  string local_408;
  string_view local_3e8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_1;
  Message local_3c0;
  allocator<char> local_3b1;
  string local_3b0;
  string_view local_390;
  undefined1 local_380 [8];
  AssertionResult gtest_ar;
  ScratchSpace scratch;
  Reflection *reflection;
  undefined1 local_350 [8];
  TestAllTypes message;
  GeneratedMessageReflectionTest_GetStringView_Test *this_local;
  
  message.field_0._808_8_ = this;
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_350);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((TestAllTypes *)local_350);
  this_00 = proto2_unittest::TestAllTypes::GetReflection();
  Reflection::ScratchSpace::ScratchSpace((ScratchSpace *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"optional_string",&local_3b1);
  pFVar2 = F(&local_3b0);
  local_390 = Reflection::GetStringView
                        (this_00,(Message *)local_350,pFVar2,(ScratchSpace *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_380,"\"115\"",
             "reflection->GetStringView(message, F(\"optional_string\"), scratch)",
             (char (*) [4])"115",&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0xb5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"optional_string_piece",&local_409);
  pFVar2 = F(&local_408);
  local_3e8 = Reflection::GetStringView
                        (this_00,(Message *)local_350,pFVar2,(ScratchSpace *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_3d8,"\"124\"",
             "reflection->GetStringView( message, F(\"optional_string_piece\"), scratch)",
             (char (*) [4])0x212f91e,&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0xb7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"optional_cord",&local_461);
  pFVar2 = F(&local_460);
  local_440 = Reflection::GetStringView
                        (this_00,(Message *)local_350,pFVar2,(ScratchSpace *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[4],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_430,"\"125\"",
             "reflection->GetStringView(message, F(\"optional_cord\"), scratch)",
             (char (*) [4])0x1df2896,&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0xb9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  Reflection::ScratchSpace::~ScratchSpace((ScratchSpace *)&gtest_ar.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_350);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, GetStringView) {
  unittest::TestAllTypes message;
  TestUtil::SetAllFields(&message);

  const Reflection* reflection = message.GetReflection();
  Reflection::ScratchSpace scratch;

  EXPECT_EQ("115",
            reflection->GetStringView(message, F("optional_string"), scratch));
  EXPECT_EQ("124", reflection->GetStringView(
                       message, F("optional_string_piece"), scratch));
  EXPECT_EQ("125",
            reflection->GetStringView(message, F("optional_cord"), scratch));
}